

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O0

char * customgetcwd(char *buf,size_t size)

{
  int iVar1;
  char *pcVar2;
  size_t in_RSI;
  char *in_RDI;
  size_t local_10;
  
  if (customgetcwd::real_getcwd == '\0') {
    iVar1 = __cxa_guard_acquire(&customgetcwd::real_getcwd);
    if (iVar1 != 0) {
      customgetcwd::real_getcwd = (getcwdFunction *)dlsym(0xffffffffffffffff,"getcwd");
      __cxa_guard_release(&customgetcwd::real_getcwd);
    }
  }
  local_10 = in_RSI;
  if (in_RDI == (char *)0x0) {
    if (in_RSI == 0) {
      local_10 = 0x1000;
    }
    in_RDI = (char *)xxmalloc(0);
  }
  pcVar2 = (*customgetcwd::real_getcwd)(in_RDI,local_10);
  return pcVar2;
}

Assistant:

char * MYCDECL CUSTOM_GETCWD(char * buf, size_t size)
{
  static getcwdFunction * real_getcwd
    = reinterpret_cast<getcwdFunction *>
    (reinterpret_cast<uintptr_t>(dlsym (RTLD_NEXT, "getcwd")));

  if (!buf) {
    if (size == 0) {
      size = PATH_MAX;
    }
    buf = (char *) xxmalloc(size);
  }
  return (real_getcwd)(buf, size);
}